

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_result_builder.hpp
# Opt level: O0

void __thiscall
Catch::ResultBuilder::useActiveException(ResultBuilder *this,Flags resultDisposition)

{
  string local_38 [36];
  Flags local_14;
  ResultBuilder *pRStack_10;
  Flags resultDisposition_local;
  ResultBuilder *this_local;
  
  (this->m_assertionInfo).resultDisposition = resultDisposition;
  local_14 = resultDisposition;
  pRStack_10 = this;
  translateActiveException_abi_cxx11_();
  std::operator<<((ostream *)&this->m_stream,local_38);
  std::__cxx11::string::~string(local_38);
  captureResult(this,ThrewException);
  return;
}

Assistant:

void ResultBuilder::useActiveException( ResultDisposition::Flags resultDisposition ) {
        m_assertionInfo.resultDisposition = resultDisposition;
        m_stream.oss << Catch::translateActiveException();
        captureResult( ResultWas::ThrewException );
    }